

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

Vector<Fad<double>_> * __thiscall
Vector<Fad<double>_>::operator=(Vector<Fad<double>_> *this,Fad<double> *val)

{
  Vector<Fad<double>_> *in_RDI;
  int i;
  Fad<double> *in_stack_ffffffffffffff98;
  Fad<double> *in_stack_ffffffffffffffa0;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int local_14;
  
  if (in_RDI->num_elts == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    ::error((string *)0x1eb69d1);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    for (local_14 = 0; local_14 < in_RDI->num_elts; local_14 = local_14 + 1) {
      Fad<double>::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  return in_RDI;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}